

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

FastString __thiscall Strings::unquotedPrintable(Strings *this,FastString *textToUnquote)

{
  byte bVar1;
  uchar c;
  byte bVar2;
  byte bVar3;
  uchar *extraout_RDX;
  QuotedDecoding dec;
  uchar *puVar4;
  uchar *puVar5;
  FastString FVar6;
  FastString out;
  String SStack_38;
  
  Bstrlib::String::String(&SStack_38);
  puVar4 = (textToUnquote->super_tagbstring).data;
  puVar5 = puVar4 + (textToUnquote->super_tagbstring).slen;
  do {
    if (puVar5 <= puVar4) {
      Bstrlib::String::String((String *)this,&SStack_38);
LAB_00113b58:
      Bstrlib::String::~String(&SStack_38);
      FVar6.super_tagbstring.data = extraout_RDX;
      FVar6.super_tagbstring._0_8_ = this;
      return (FastString)FVar6.super_tagbstring;
    }
    while (c = *puVar4, c == '=') {
      bVar3 = puVar4[1];
      if (bVar3 == 0xd) {
        puVar4 = puVar4 + 3;
      }
      else {
        bVar2 = bVar3 - 0x30;
        if (bVar2 < 10) {
LAB_00113af6:
          bVar1 = puVar4[2];
          bVar3 = bVar1 - 0x30;
          if (9 < bVar3) {
            if ((0x25 < bVar1 - 0x41) ||
               ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0)) goto LAB_00113b49;
            if (bVar1 < 0x47) {
              bVar3 = bVar1 - 0x37;
            }
            else {
              bVar3 = bVar1 + 0xa9;
            }
          }
          puVar4 = puVar4 + 3;
          c = bVar2 * '\x10' + bVar3;
          goto LAB_00113b2c;
        }
        if (bVar3 != 10) {
          if ((bVar3 - 0x41 < 0x26) && ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) != 0))
          {
            if (bVar3 < 0x47) {
              bVar2 = bVar3 - 0x37;
            }
            else {
              bVar2 = bVar3 + 0xa9;
            }
            goto LAB_00113af6;
          }
LAB_00113b49:
          Bstrlib::String::String((String *)this,"");
          goto LAB_00113b58;
        }
        puVar4 = puVar4 + 2;
      }
    }
    puVar4 = puVar4 + 1;
LAB_00113b2c:
    Bstrlib::String::operator+=(&SStack_38,c);
  } while( true );
}

Assistant:

FastString unquotedPrintable(const FastString & textToUnquote)
    {
        FastString out; QuotedDecoding dec(out);
        const char * text = (const char *)textToUnquote, *end = text + textToUnquote.getLength();
        while (text < end)
        {
            char ch = 0;
            if (!dec.unquoteChar(text, ch)) return "";
            out += ch;
        }
        return out;
    }